

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_impl.hpp
# Opt level: O0

string * toml::to_string_abi_cxx11_(integer_format c)

{
  string *in_RDI;
  ostringstream oss;
  integer_format in_stack_fffffffffffffe4f;
  string *os;
  ostringstream local_188 [392];
  
  os = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  operator<<((ostream *)os,in_stack_fffffffffffffe4f);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

TOML11_INLINE std::string to_string(const integer_format c)
{
    std::ostringstream oss;
    oss << c;
    return oss.str();
}